

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O2

void translate_coords_to_owner(Am_Object *in_obj,Am_Object *ref_obj,int x,int y,int *x1,int *y1)

{
  bool bVar1;
  Am_Object owner;
  Am_Object local_38;
  Am_Object local_30;
  
  local_38.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Owner(&local_30,(Am_Slot_Flags)in_obj);
  Am_Object::operator=(&local_38,&local_30);
  Am_Object::~Am_Object(&local_30);
  bVar1 = Am_Object::Valid(&local_38);
  if (bVar1) {
    bVar1 = Am_Object::operator==(&local_38,ref_obj);
    if (bVar1) {
      *x1 = x;
      *y1 = y;
      goto LAB_002713a1;
    }
  }
  Am_Translate_Coordinates(ref_obj,x,y,&local_38,x1,y1);
LAB_002713a1:
  Am_Object::~Am_Object(&local_38);
  return;
}

Assistant:

void
translate_coords_to_owner(Am_Object in_obj, Am_Object ref_obj, int x, int y,
                          int &x1, int &y1)
{
  Am_Object owner;
  owner = in_obj.Get_Owner();
  if (owner.Valid() && owner == ref_obj) {
    x1 = x;
    y1 = y; //already OK
  } else    //not the owner, use expensive transformation
    Am_Translate_Coordinates(ref_obj, x, y, owner, x1, y1);
}